

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_new_string(qpdf_data qpdf,char *str)

{
  char *__s;
  char *qpdf_00;
  qpdf_oh qVar1;
  allocator<char> local_49;
  string local_48;
  QPDFObjectHandle local_28;
  char *local_18;
  char *str_local;
  qpdf_data qpdf_local;
  
  local_18 = str;
  str_local = (char *)qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_oh_new_string",0);
  qpdf_00 = str_local;
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  QPDFObjectHandle::newString(&local_28,&local_48);
  qVar1 = new_object((qpdf_data)qpdf_00,&local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_string(qpdf_data qpdf, char const* str)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_string");
    return new_object(qpdf, QPDFObjectHandle::newString(str));
}